

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pfx.c
# Opt level: O0

void mass_test(void)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  uint local_a0;
  uint local_9c;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  uint32_t max_i;
  uint32_t min_i;
  pfxv_state res;
  pfx_table pfxt;
  pfx_record pfx;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pfx_table_init((pfx_table *)&min_i,(pfx_update_fp)0x0);
  printf("Inserting %u records\n",0x2ffd0);
  for (i_2 = 0xfffffff0; 0xfffeffff < i_2; i_2 = i_2 - 1) {
    pfxt.lock.__data.__flags = i_2;
    htonl(i_2);
    pfxt.lock._52_4_ = 0;
    iVar2 = pfx_table_add((pfx_table *)&min_i,(pfx_record *)((long)&pfxt.lock + 0x30));
    if (iVar2 != 0) {
      __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x7b,"void mass_test(void)");
    }
    pfxt.lock.__data.__flags = i_2 + 1;
    iVar2 = pfx_table_add((pfx_table *)&min_i,(pfx_record *)((long)&pfxt.lock + 0x30));
    if (iVar2 != 0) {
      __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x7e,"void mass_test(void)");
    }
    pfxt.lock._52_4_ = 1;
    iVar2 = pfx_table_add((pfx_table *)&min_i,(pfx_record *)((long)&pfxt.lock + 0x30));
    if (iVar2 != 0) {
      __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x85,"void mass_test(void)");
    }
  }
  printf("validating..\n");
  local_9c = 0xfffffff0;
  while( true ) {
    if (local_9c < 0xffff0000) {
      printf("removing records\n");
      local_a0 = 0xfffffff0;
      while( true ) {
        if (local_a0 < 0xffff0000) {
          pfx_table_free((pfx_table *)&min_i);
          printf("%s() successful\n","mass_test");
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            return;
          }
          __stack_chk_fail();
        }
        pfxt.lock.__data.__flags = local_a0;
        pfxt.lock._52_4_ = 0;
        htonl(local_a0);
        iVar2 = pfx_table_remove((pfx_table *)&min_i,(pfx_record *)((long)&pfxt.lock + 0x30));
        if (iVar2 != 0) {
          __assert_fail("pfx_table_remove(&pfxt, &pfx) == PFX_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                        ,0xa7,"void mass_test(void)");
        }
        pfxt.lock.__data.__flags = local_a0 + 1;
        iVar2 = pfx_table_remove((pfx_table *)&min_i,(pfx_record *)((long)&pfxt.lock + 0x30));
        if (iVar2 != 0) {
          __assert_fail("pfx_table_remove(&pfxt, &pfx) == PFX_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                        ,0xaa,"void mass_test(void)");
        }
        pfxt.lock._52_4_ = 1;
        iVar2 = pfx_table_remove((pfx_table *)&min_i,(pfx_record *)((long)&pfxt.lock + 0x30));
        if (iVar2 != 0) break;
        local_a0 = local_a0 - 1;
      }
      __assert_fail("pfx_table_remove(&pfxt, &pfx) == PFX_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0xb1,"void mass_test(void)");
    }
    pfxt.lock._52_4_ = 0;
    htonl(local_9c);
    iVar2 = pfx_table_validate((pfx_table *)&min_i,local_9c,
                               (lrtr_ip_addr *)((long)&pfxt.lock + 0x34),' ',&max_i);
    if (iVar2 != 0) {
      __assert_fail("pfx_table_validate(&pfxt, i, &pfx.prefix, pfx.min_len, &res) == PFX_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x8f,"void mass_test(void)");
    }
    if (max_i != 0) {
      __assert_fail("res == BGP_PFXV_STATE_VALID",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x90,"void mass_test(void)");
    }
    iVar2 = pfx_table_validate((pfx_table *)&min_i,local_9c + 1,
                               (lrtr_ip_addr *)((long)&pfxt.lock + 0x34),' ',&max_i);
    if (iVar2 != 0) {
      __assert_fail("pfx_table_validate(&pfxt, i + 1, &pfx.prefix, pfx.min_len, &res) == PFX_SUCCESS"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x91,"void mass_test(void)");
    }
    if (max_i != 0) {
      __assert_fail("res == BGP_PFXV_STATE_VALID",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x92,"void mass_test(void)");
    }
    pfxt.lock._52_4_ = 1;
    iVar2 = pfx_table_validate((pfx_table *)&min_i,local_9c + 1,
                               (lrtr_ip_addr *)((long)&pfxt.lock + 0x34),0x80,&max_i);
    if (iVar2 != 0) {
      __assert_fail("pfx_table_validate(&pfxt, i + 1, &pfx.prefix, pfx.min_len, &res) == PFX_SUCCESS"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x9a,"void mass_test(void)");
    }
    if (max_i != 0) break;
    local_9c = local_9c - 1;
  }
  __assert_fail("res == BGP_PFXV_STATE_VALID",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                ,0x9b,"void mass_test(void)");
}

Assistant:

static void mass_test(void)
{
	struct pfx_table pfxt;
	struct pfx_record pfx;
	enum pfxv_state res;
	const uint32_t min_i = 0xFFFF0000;
	const uint32_t max_i = 0xFFFFFFF0;
	/* init table with huge number of records */
	pfx_table_init(&pfxt, NULL);
	printf("Inserting %u records\n", (max_i - min_i) * 3);
	for (uint32_t i = max_i; i >= min_i; i--) {
		pfx.min_len = 32;
		pfx.max_len = 32;
		pfx.socket = NULL;
		pfx.asn = i;
		pfx.prefix.u.addr4.addr = htonl(i);
		pfx.prefix.ver = LRTR_IPV4;
		assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);
		/* add same prefix, with diff asn */
		pfx.asn = i + 1;
		assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);
		/* add same prefix, with diff len */
		pfx.min_len = 128;
		pfx.max_len = 128;
		pfx.prefix.ver = LRTR_IPV6;
		((uint32_t *)pfx.prefix.u.addr6.addr)[2] = max_i;
		((uint32_t *)pfx.prefix.u.addr6.addr)[0] = min_i + i;
		assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);
	}

	/* verify validation of huge number of records */
	printf("validating..\n");
	for (uint32_t i = max_i; i >= min_i; i--) {
		pfx.min_len = 32;
		pfx.max_len = 32;
		pfx.prefix.ver = LRTR_IPV4;
		pfx.prefix.u.addr4.addr = htonl(i);
		assert(pfx_table_validate(&pfxt, i, &pfx.prefix, pfx.min_len, &res) == PFX_SUCCESS);
		assert(res == BGP_PFXV_STATE_VALID);
		assert(pfx_table_validate(&pfxt, i + 1, &pfx.prefix, pfx.min_len, &res) == PFX_SUCCESS);
		assert(res == BGP_PFXV_STATE_VALID);

		pfx.min_len = 128;
		pfx.max_len = 128;
		pfx.prefix.ver = LRTR_IPV6;
		((uint32_t *)pfx.prefix.u.addr6.addr)[2] = max_i;
		((uint32_t *)pfx.prefix.u.addr6.addr)[0] = min_i + i;

		assert(pfx_table_validate(&pfxt, i + 1, &pfx.prefix, pfx.min_len, &res) == PFX_SUCCESS);
		assert(res == BGP_PFXV_STATE_VALID);
	}

	/* verify removal of huge number of records */
	printf("removing records\n");
	for (uint32_t i = max_i; i >= min_i; i--) {
		pfx.socket = NULL;
		pfx.min_len = 32;
		pfx.max_len = 32;
		pfx.asn = i;
		pfx.prefix.ver = LRTR_IPV4;
		pfx.prefix.u.addr4.addr = htonl(i);
		assert(pfx_table_remove(&pfxt, &pfx) == PFX_SUCCESS);

		pfx.asn = i + 1;
		assert(pfx_table_remove(&pfxt, &pfx) == PFX_SUCCESS);

		pfx.prefix.ver = LRTR_IPV6;
		pfx.min_len = 128;
		pfx.max_len = 128;
		((uint32_t *)pfx.prefix.u.addr6.addr)[2] = max_i;
		((uint32_t *)pfx.prefix.u.addr6.addr)[0] = min_i + i;
		assert(pfx_table_remove(&pfxt, &pfx) == PFX_SUCCESS);
	}

	/* cleanup: free table */
	pfx_table_free(&pfxt);
	printf("%s() successful\n", __func__);
}